

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::Reflection::MutableMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  bool bVar1;
  CppType CVar2;
  Reflection *pRVar3;
  Descriptor *actual;
  Descriptor *pDVar4;
  ExtensionSet *this_00;
  OneofDescriptor *oneof_descriptor;
  Message *pMVar5;
  Arena *pAVar6;
  Message *default_message_1;
  Message *default_message;
  Message **result_holder;
  Message *result;
  MessageFactory *factory_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  pRVar3 = Message::GetReflection(message);
  if (this != pRVar3) {
    pDVar4 = this->descriptor_;
    actual = Message::GetDescriptor(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar4,actual,field,"MutableMessage");
  }
  pDVar4 = FieldDescriptor::containing_type(field);
  if (pDVar4 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage","Field does not match message type.");
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage",
               "Field is repeated; the method requires a singular field.");
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 != CPPTYPE_MESSAGE) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,field,"MutableMessage",CPPTYPE_MESSAGE);
  }
  result = (Message *)factory;
  if (factory == (MessageFactory *)0x0) {
    result = (Message *)this->message_factory_;
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,message);
    this_local = (Reflection *)
                 internal::ExtensionSet::MutableMessage(this_00,field,(MessageFactory *)result);
  }
  else {
    default_message = (Message *)MutableRaw<google::protobuf::Message*>(this,message,field);
    bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
    if (bVar1) {
      bVar1 = HasOneofField(this,message,field);
      if (!bVar1) {
        oneof_descriptor = FieldDescriptor::containing_oneof(field);
        ClearOneof(this,message,oneof_descriptor);
        default_message = (Message *)MutableField<google::protobuf::Message*>(this,message,field);
        pMVar5 = GetDefaultMessageInstance(this,field);
        pAVar6 = MessageLite::GetArena(&message->super_MessageLite);
        pMVar5 = Message::New(pMVar5,pAVar6);
        (default_message->super_MessageLite)._vptr_MessageLite = (_func_int **)pMVar5;
      }
    }
    else {
      SetHasBit(this,message,field);
    }
    if ((default_message->super_MessageLite)._vptr_MessageLite == (_func_int **)0x0) {
      pMVar5 = GetDefaultMessageInstance(this,field);
      pAVar6 = MessageLite::GetArena(&message->super_MessageLite);
      pMVar5 = Message::New(pMVar5,pAVar6);
      (default_message->super_MessageLite)._vptr_MessageLite = (_func_int **)pMVar5;
    }
    this_local = (Reflection *)(default_message->super_MessageLite)._vptr_MessageLite;
  }
  return (Message *)this_local;
}

Assistant:

Message* Reflection::MutableMessage(Message* message,
                                    const FieldDescriptor* field,
                                    MessageFactory* factory) const {
  USAGE_MUTABLE_CHECK_ALL(MutableMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableMessage(field, factory));
  } else {
    Message* result;

    Message** result_holder = MutableRaw<Message*>(message, field);

    if (schema_.InRealOneof(field)) {
      if (!HasOneofField(*message, field)) {
        ClearOneof(message, field->containing_oneof());
        result_holder = MutableField<Message*>(message, field);
        const Message* default_message = GetDefaultMessageInstance(field);
        *result_holder = default_message->New(message->GetArena());
      }
    } else {
      SetHasBit(message, field);
    }

    if (*result_holder == nullptr) {
      const Message* default_message = GetDefaultMessageInstance(field);
      *result_holder = default_message->New(message->GetArena());
    }
    result = *result_holder;
    return result;
  }
}